

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol_check_data.h
# Opt level: O0

double __thiscall mp::VarVecRecomp::operator[](VarVecRecomp *this,int i)

{
  bool bVar1;
  reference pvVar2;
  int in_ESI;
  vector<double,_std::allocator<double>_> *in_RDI;
  double dVar3;
  reference rVar4;
  VarInfoRecomp *in_stack_ffffffffffffffc0;
  _Bit_reference in_stack_ffffffffffffffd0;
  size_type __n;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffffe0;
  vector<bool,_std::allocator<bool>_> *this_00;
  
  rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                    (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd0._M_mask);
  this_00 = (vector<bool,_std::allocator<bool>_> *)rVar4._M_p;
  bVar1 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&stack0xffffffffffffffe0);
  __n = in_stack_ffffffffffffffd0._M_mask;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    dVar3 = std::function<double_(int,_const_mp::VarInfoRecomp_&)>::operator()
                      ((function<double_(int,_const_mp::VarInfoRecomp_&)> *)
                       in_stack_ffffffffffffffd0._M_p,(int)((ulong)in_RDI >> 0x20),
                       in_stack_ffffffffffffffc0);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,(long)in_ESI);
    *pvVar2 = dVar3;
    std::vector<bool,_std::allocator<bool>_>::operator[](this_00,__n);
    std::_Bit_reference::operator=((_Bit_reference *)&stack0xffffffffffffffd0,true);
  }
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,(long)in_ESI);
  return *pvVar2;
}

Assistant:

double operator[]( int i ) const {
    assert(i>=0 && i<(int)x_.size());
    assert(p_var_info_recomp_ != nullptr);
    if (!is_recomp_[i]) {
      x_[i] = recomp_fn_(i, *p_var_info_recomp_);
      is_recomp_[i] = true;
    }
    return x_[i];
  }